

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O2

int __thiscall
Signal<std::shared_ptr<Reaction>_>::ConnectMember<Gillespie>
          (Signal<std::shared_ptr<Reaction>_> *this,Gillespie *inst,offset_in_Gillespie_to_subr func
          )

{
  int iVar1;
  function<void_(std::shared_ptr<Reaction>)> fStack_48;
  anon_class_24_2_3f47e9d7 local_28;
  
  local_28.inst = inst;
  local_28.func = func;
  std::function<void(std::shared_ptr<Reaction>)>::
  function<Signal<std::shared_ptr<Reaction>>::ConnectMember<Gillespie>(Gillespie*,void(Gillespie::*)(std::shared_ptr<Reaction>))::_lambda(std::shared_ptr<Reaction>)_1_,void>
            ((function<void(std::shared_ptr<Reaction>)> *)&fStack_48,&local_28);
  iVar1 = Connect(this,&fStack_48);
  std::_Function_base::~_Function_base(&fStack_48.super__Function_base);
  return iVar1;
}

Assistant:

int ConnectMember(T *inst, void (T::*func)(Args...)) {
    return Connect([=](Args... args) { (inst->*func)(args...); });
  }